

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,string_type *s,
          string_format_info *fmt,source_location *loc)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  serialization_error *psVar3;
  char (*s_00) [4];
  char (*s_01) [4];
  char __c;
  allocator<char> local_2f1;
  string_type local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  source_location local_210;
  source_location local_198;
  source_location local_120;
  source_location local_a8;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(fmt->fmt) {
  case basic:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'\"');
    escape_basic_string(&local_2f0,this,s);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    __c = '\"';
    break;
  case literal:
    pcVar1 = (s->_M_dataplus)._M_p;
    local_2f0._M_dataplus._M_p._0_1_ = 10;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (pcVar1,pcVar1 + s->_M_string_length);
    if (_Var2._M_current != (s->_M_dataplus)._M_p + s->_M_string_length) {
      psVar3 = (serialization_error *)__cxa_allocate_exception(0xa0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,
                 "toml::serializer: (non-multiline) literal string cannot have a newline",
                 (allocator<char> *)&local_2f0);
      source_location::source_location(&local_a8,loc);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"here",&local_2f1);
      format_error<>(&local_230,&local_250,&local_a8,&local_270);
      source_location::source_location(&local_120,loc);
      serialization_error::serialization_error(psVar3,&local_230,&local_120);
      __cxa_throw(psVar3,&serialization_error::typeinfo,serialization_error::~serialization_error);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'\'');
    __c = '\'';
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s);
    break;
  case multiline_basic:
    string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
    ::invoke<4ul>(&local_2f0,
                  (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                   *)"\"\"\"",(char (*) [4])s);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    if (fmt->start_with_newline == true) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,'\n');
    }
    escape_ml_basic_string(&local_2f0,this,s);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
    ::invoke<4ul>(&local_2f0,
                  (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                   *)"\"\"\"",s_00);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0);
    goto LAB_0034089d;
  case multiline_literal:
    string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
    ::invoke<4ul>(&local_2f0,
                  (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                   *)"\'\'\'",(char (*) [4])s);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    if (fmt->start_with_newline == true) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,'\n');
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s);
    string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
    ::invoke<4ul>(&local_2f0,
                  (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                   *)"\'\'\'",s_01);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0);
LAB_0034089d:
    std::__cxx11::string::~string((string *)&local_2f0);
    return __return_storage_ptr__;
  default:
    psVar3 = (serialization_error *)__cxa_allocate_exception(0xa0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,
               "[error] toml::serializer::operator()(string): invalid string_format value",
               (allocator<char> *)&local_2f0);
    source_location::source_location(&local_198,loc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"here",&local_2f1);
    format_error<>(&local_290,&local_2b0,&local_198,&local_2d0);
    source_location::source_location(&local_210,loc);
    serialization_error::serialization_error(psVar3,&local_290,&local_210);
    __cxa_throw(psVar3,&serialization_error::typeinfo,serialization_error::~serialization_error);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,__c);
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(string_type s, const string_format_info& fmt, const source_location& loc) // {{{
    {
        string_type retval;
        switch(fmt.fmt)
        {
            case string_format::basic:
            {
                retval += char_type('"');
                retval += this->escape_basic_string(s);
                retval += char_type('"');
                return retval;
            }
            case string_format::literal:
            {
                if(std::find(s.begin(), s.end(), char_type('\n')) != s.end())
                {
                    throw serialization_error(format_error("toml::serializer: "
                        "(non-multiline) literal string cannot have a newline",
                        loc, "here"), loc);
                }
                retval += char_type('\'');
                retval += s;
                retval += char_type('\'');
                return retval;
            }
            case string_format::multiline_basic:
            {
                retval += string_conv<string_type>("\"\"\"");
                if(fmt.start_with_newline)
                {
                    retval += char_type('\n');
                }

                retval += this->escape_ml_basic_string(s);

                retval += string_conv<string_type>("\"\"\"");
                return retval;
            }
            case string_format::multiline_literal:
            {
                retval += string_conv<string_type>("'''");
                if(fmt.start_with_newline)
                {
                    retval += char_type('\n');
                }
                retval += s;
                retval += string_conv<string_type>("'''");
                return retval;
            }
            default:
            {
                throw serialization_error(format_error(
                    "[error] toml::serializer::operator()(string): "
                    "invalid string_format value", loc, "here"), loc);
            }
        }
    }